

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartTls-Example.cpp
# Opt level: O3

void ServerThread(bool *bStop)

{
  int iVar1;
  int *piVar2;
  bool bClientConnected;
  TcpServer sock;
  byte local_d9;
  BaseSocket local_d8;
  timespec local_c8;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  TcpServer::TcpServer((TcpServer *)&local_d8);
  local_d9 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:44:28)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:44:28)>
             ::_M_manager;
  BaseSocket::BindErrorFunction
            ((function<void_(BaseSocket_*)> *)&local_30,&local_d8,
             (function<void_(BaseSocket_*)> *)&local_98);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:45:28)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:45:28)>
             ::_M_manager;
  BaseSocket::BindCloseFunction
            ((function<void_(BaseSocket_*)> *)&local_50,&local_d8,
             (function<void_(BaseSocket_*)> *)&local_b8);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = &local_d9;
  local_58 = std::
             _Function_handler<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:47:28)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/StartTls-Example.cpp:47:28)>
             ::_M_manager;
  TcpServer::BindNewConnection
            ((TcpServer *)&local_d8,
             (function<void_(const_std::vector<TcpSocket_*,_std::allocator<TcpSocket_*>_>_&)> *)
             &local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  TcpServer::Start((TcpServer *)&local_d8,"0.0.0.0",0xd85);
  if ((*bStop == false) || ((local_d9 & 1) != 0)) {
    do {
      local_c8.tv_sec = 0;
      local_c8.tv_nsec = 10000000;
      do {
        iVar1 = nanosleep(&local_c8,&local_c8);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    } while ((*bStop == false) || ((local_d9 & 1) != 0));
  }
  TcpServer::Close((TcpServer *)&local_d8);
  BaseSocket::~BaseSocket(&local_d8);
  return;
}

Assistant:

void ServerThread(const bool* bStop)
{
    TcpServer sock;
    bool bClientConnected = false;

    // 3 callback function to handle the server socket events
    sock.BindErrorFunction([&](BaseSocket* pSock) { cout << "Server: socket error" << endl << flush; pSock->Close(); }); // Must call Close function
    sock.BindCloseFunction([&](BaseSocket*) { cout << "Server: socket closing" << endl << flush; });

    sock.BindNewConnection([&](const vector<TcpSocket*>& lstSockets)
    {
        // a list with sockets new connected
        for (auto& pSocket : lstSockets)
        {
            if (pSocket != nullptr)
            {
                bClientConnected = true;

                // 3 callback functions to handle the sockets events
                pSocket->BindFuncBytesReceived([&](TcpSocket* pSock)
                {
                    const size_t nAvalible = pSock->GetBytesAvailable();

                    if (nAvalible == 0) // Socket closed on remote
                    {
                        pSock->Close();
                        return;
                    }

                    auto spBuffer = make_unique<uint8_t[]>(nAvalible + 1);

                    const size_t nRead = pSock->Read(spBuffer.get(), nAvalible);

                    if (nRead > 0)
                    {
                        string strRec(nRead, 0);
                        copy(&spBuffer[0], &spBuffer[nRead], &strRec[0]);

                        if (strRec == "STARTTLS")
                        {
                            SslTcpSocket* pSslTcpSocket = SslTcpSocket::SwitchToSll(pSock);
                            pSock->SelfDestroy();
                            if (pSslTcpSocket->AddServerCertificate("certs/ca-root.crt", "certs/127-0-0-1.crt", "certs/127-0-0-1-key.pem", nullptr) == false)
                            {
                                cout << "Server: can't load certificate" << endl;
                                pSslTcpSocket->Close();
                                return;
                            }
                            pSslTcpSocket->SetAcceptState();
                            pSslTcpSocket->StartReceiving();
                            pSslTcpSocket->Write("Server Hello Message with TLS", 29);
                            return;
                        }

                        stringstream strOutput;
                        strOutput << pSock->GetClientAddr() << " - Server received: " << nRead << " Bytes, \"" << strRec << "\"" << endl;

                        cout << strOutput.str() << flush;

                        strRec = "Server echo: " + strRec;
                        pSock->Write(&strRec[0], strRec.size());

                        //pSock->Close(); // Optional, if you don't close the socket, the connection stays open
                    }
                });
                pSocket->BindErrorFunction([&](BaseSocket* pSock)
                {
                    // there was an error, we close the socket
                    pSock->Close();
                    cout << "Server: accept socket error" << endl << flush;
                });
                pSocket->BindCloseFunction([&](BaseSocket* pSock)
                {
                    // We let the socket destroy it self, use this on sockets received by the server
                    bClientConnected = false;
                    cout << "Server: accept socket closing" << endl << flush;
                });

                pSocket->StartReceiving();  // start to receive data
                pSocket->Write("Server Hello Message none TLS", 29);
            }
        }
    });


    // start der server socket
    const bool bCreated = sock.Start("0.0.0.0", 3461);    // IPv6 use "::1" as address

    while (*bStop == false || bClientConnected == true)
    {
        this_thread::sleep_for(chrono::milliseconds(10));
    }

    // Closing the server socket will not call the close callback
    sock.Close();
}